

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

int Vec_WecSizeUsedLimits(Vec_Wec_t *p,int iStart,int iStop)

{
  int iVar1;
  Vec_Int_t *p_00;
  undefined4 local_28;
  undefined4 local_24;
  int Counter;
  int i;
  Vec_Int_t *vVec;
  int iStop_local;
  int iStart_local;
  Vec_Wec_t *p_local;
  
  local_28 = 0;
  for (local_24 = iStart; local_24 < iStop; local_24 = local_24 + 1) {
    p_00 = Vec_WecEntry(p,local_24);
    iVar1 = Vec_IntSize(p_00);
    local_28 = (uint)(0 < iVar1) + local_28;
  }
  return local_28;
}

Assistant:

static inline int Vec_WecSizeUsedLimits( Vec_Wec_t * p, int iStart, int iStop )
{
    Vec_Int_t * vVec;
    int i, Counter = 0;
    Vec_WecForEachLevelStartStop( p, vVec, i, iStart, iStop )
        Counter += (int)(Vec_IntSize(vVec) > 0);
    return Counter;
}